

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statements.cpp
# Opt level: O3

Function * __thiscall Functions::returnFunction(Functions *this,Function *function)

{
  bool bVar1;
  pointer ppFVar2;
  pointer ppFVar3;
  int iVar4;
  ulong uVar5;
  string findFID;
  string stackFID;
  vector<Function_*,_std::allocator<Function_*>_> local_90;
  vector<Function_*,_std::allocator<Function_*>_> local_78;
  long *local_58;
  pointer local_50;
  long local_48 [2];
  Function *local_38;
  
  uVar5 = 0;
  do {
    std::vector<Function_*,_std::allocator<Function_*>_>::vector(&local_78,&this->_functionStack);
    ppFVar3 = local_78.super__Vector_base<Function_*,_std::allocator<Function_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    ppFVar2 = local_78.super__Vector_base<Function_*,_std::allocator<Function_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (local_78.super__Vector_base<Function_*,_std::allocator<Function_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_78.super__Vector_base<Function_*,_std::allocator<Function_*>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_78.super__Vector_base<Function_*,_std::allocator<Function_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_78.super__Vector_base<Function_*,_std::allocator<Function_*>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if ((ulong)((long)ppFVar3 - (long)ppFVar2 >> 3) <= uVar5) {
      return local_38;
    }
    (*(function->super_Statement)._vptr_Statement[3])(&local_78,function);
    std::vector<Function_*,_std::allocator<Function_*>_>::vector(&local_90,&this->_functionStack);
    (*(local_90.super__Vector_base<Function_*,_std::allocator<Function_*>_>._M_impl.
       super__Vector_impl_data._M_start[uVar5]->super_Statement)._vptr_Statement[3])(&local_58);
    if (local_90.super__Vector_base<Function_*,_std::allocator<Function_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_90.super__Vector_base<Function_*,_std::allocator<Function_*>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_90.super__Vector_base<Function_*,_std::allocator<Function_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_90.super__Vector_base<Function_*,_std::allocator<Function_*>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if ((local_78.super__Vector_base<Function_*,_std::allocator<Function_*>_>._M_impl.
         super__Vector_impl_data._M_finish == local_50) &&
       ((local_78.super__Vector_base<Function_*,_std::allocator<Function_*>_>._M_impl.
         super__Vector_impl_data._M_finish == (pointer)0x0 ||
        (iVar4 = bcmp(local_78.super__Vector_base<Function_*,_std::allocator<Function_*>_>._M_impl.
                      super__Vector_impl_data._M_start,local_58,
                      (size_t)local_78.super__Vector_base<Function_*,_std::allocator<Function_*>_>.
                              _M_impl.super__Vector_impl_data._M_finish), iVar4 == 0)))) {
      std::vector<Function_*,_std::allocator<Function_*>_>::vector(&local_90,&this->_functionStack);
      local_38 = local_90.super__Vector_base<Function_*,_std::allocator<Function_*>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar5];
      operator_delete(local_90.super__Vector_base<Function_*,_std::allocator<Function_*>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_90.super__Vector_base<Function_*,_std::allocator<Function_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_90.super__Vector_base<Function_*,_std::allocator<Function_*>_>.
                            _M_impl.super__Vector_impl_data._M_start);
      bVar1 = true;
    }
    else {
      bVar1 = false;
    }
    if (local_58 != local_48) {
      operator_delete(local_58,local_48[0] + 1);
    }
    if (local_78.super__Vector_base<Function_*,_std::allocator<Function_*>_>._M_impl.
        super__Vector_impl_data._M_start !=
        (pointer)&local_78.super__Vector_base<Function_*,_std::allocator<Function_*>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
      operator_delete(local_78.super__Vector_base<Function_*,_std::allocator<Function_*>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_78.super__Vector_base<Function_*,_std::allocator<Function_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage + 1);
    }
    uVar5 = uVar5 + 1;
  } while (!bVar1);
  return local_38;
}

Assistant:

Function *Functions::returnFunction(Function *function) {
    for(int i = 0; i < getFunctionStack().size();i++){
        std::string findFID =function->id();
        std::string stackFID = getFunctionStack()[i]->id();
        if(findFID == stackFID ) {
            return getFunctionStack()[i];
        }
    }
}